

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

void __thiscall QTest::WatchDog::run(WatchDog *this)

{
  Expectation e;
  bool bVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  long in_FS_OFFSET;
  undefined1 auStack_48 [40];
  undefined1 uStack_20;
  undefined7 uStack_1f;
  undefined8 local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CrashHandler::blockUnixSignals();
  auStack_48._32_8_ = &this->mutex;
  _uStack_20 = (__pthread_internal_list *)0xaaaaaaaaaaaaaa00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(auStack_48 + 0x20));
  uStack_20 = 1;
  (this->expecting)._M_i = TestFunctionStart;
  std::condition_variable::notify_all();
  do {
    while( true ) {
      e = (this->expecting)._M_i;
      uVar2 = (ulong)((uint)e & 3);
      if (uVar2 - 1 < 2) break;
      if (uVar2 != 0) {
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(auStack_48 + 0x20));
        if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) ==
            (__pthread_internal_list *)local_18) {
          return;
        }
LAB_00136996:
        __stack_chk_fail();
      }
    }
    bVar1 = waitFor(this,(unique_lock<std::mutex> *)(auStack_48 + 0x20),e);
  } while (bVar1);
  fflush(_stderr);
  CrashHandler::printTestRunTime();
  CrashHandler::generateStackTrace();
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == (__pthread_internal_list *)local_18) {
    run((WatchDog *)auStack_48);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(auStack_48 + 0x20));
    if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == (__pthread_internal_list *)local_18) {
      _Unwind_Resume(extraout_RAX);
    }
  }
  goto LAB_00136996;
}

Assistant:

void run() override
    {
        CrashHandler::blockUnixSignals();
        auto locker = qt_unique_lock(mutex);
        expecting.store(TestFunctionStart, std::memory_order_release);
        waitCondition.notify_all();
        while (true) {
            Expectation e = expecting.load(std::memory_order_acquire);
            switch (state(e)) {
            case ThreadEnd:
                return;
            case ThreadStart:
                Q_UNREACHABLE();
            case TestFunctionStart:
            case TestFunctionEnd:
                if (Q_UNLIKELY(!waitFor(locker, e))) {
                    std::fflush(stderr);
                    CrashHandler::printTestRunTime();
                    CrashHandler::generateStackTrace();
                    qFatal("Test function timed out");
                }
            }
        }
    }